

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_audio.c
# Opt level: O1

void sys_audiodevnumbertoname(int output,int devno,char *name,int namesize)

{
  char *__src;
  int noutdevs;
  int nindevs;
  int cancallback;
  int canmulti;
  char outdevlist [16384];
  char indevlist [16384];
  
  nindevs = 0;
  noutdevs = 0;
  if (devno < 0) goto LAB_00172314;
  sys_get_audio_devs(indevlist,&nindevs,outdevlist,&noutdevs,&canmulti,&cancallback,0x80,0x80,
                     audio_nextsettings.a_api);
  if ((output == 0) || (noutdevs <= devno)) {
    if ((output == 0) && (devno < nindevs)) {
      __src = indevlist + (uint)(devno << 7);
      goto LAB_001722fe;
    }
    *name = '\0';
  }
  else {
    __src = outdevlist + (uint)(devno << 7);
LAB_001722fe:
    strncpy(name,__src,(long)namesize);
  }
  name = name + ((long)namesize - 1);
LAB_00172314:
  *name = '\0';
  return;
}

Assistant:

void sys_audiodevnumbertoname(int output, int devno, char *name, int namesize)
{
    char indevlist[MAXNDEV*DEVDESCSIZE], outdevlist[MAXNDEV*DEVDESCSIZE];
    int nindevs = 0, noutdevs = 0, canmulti, cancallback;
    if (devno < 0)
    {
        *name = 0;
        return;
    }
    sys_get_audio_devs(indevlist, &nindevs, outdevlist, &noutdevs,
        &canmulti, &cancallback, MAXNDEV, DEVDESCSIZE,
            audio_nextsettings.a_api);
    if (output && (devno < noutdevs))
        strncpy(name, outdevlist + devno * DEVDESCSIZE, namesize);
    else if (!output && (devno < nindevs))
        strncpy(name, indevlist + devno * DEVDESCSIZE, namesize);
    else *name = 0;
    name[namesize-1] = 0;
}